

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

token * dmrC_expect_token(dmr_C *C,token *token,int op,char *where)

{
  int iVar1;
  char *pcVar2;
  char *where_local;
  int op_local;
  token *token_local;
  dmr_C *C_local;
  
  iVar1 = dmrC_match_op(token,op);
  if (iVar1 == 0) {
    if (token != &dmrC_expect_token::bad_token) {
      dmrC_expect_token::bad_token.next = token;
      pcVar2 = dmrC_show_special(C,op);
      dmrC_sparse_error(C,token->pos,"Expected %s %s",pcVar2,where);
      pcVar2 = dmrC_show_token(C,token);
      dmrC_sparse_error(C,token->pos,"got %s",pcVar2);
    }
    if (op == 0x3b) {
      C_local = (dmr_C *)dmrC_skip_to_token(token,0x3b);
    }
    else {
      C_local = (dmr_C *)&dmrC_expect_token::bad_token;
    }
  }
  else {
    C_local = (dmr_C *)token->next;
  }
  return (token *)C_local;
}

Assistant:

struct token *dmrC_expect_token(struct dmr_C *C, struct token *token, int op, const char *where)
{
	if (!dmrC_match_op(token, op)) {
		static struct token bad_token;
		if (token != &bad_token) {
			bad_token.next = token;
			dmrC_sparse_error(C, token->pos, "Expected %s %s", dmrC_show_special(C, op), where);
			dmrC_sparse_error(C, token->pos, "got %s", dmrC_show_token(C, token));
		}
		if (op == ';')
			return dmrC_skip_to_token(token, op);
		return &bad_token;
	}
	return token->next;
}